

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AutoGeometry.cpp
# Opt level: O1

char * __thiscall HACD::MyAutoGeometry::stristr(MyAutoGeometry *this,char *str,char *key)

{
  char c;
  size_t sVar1;
  char *pcVar2;
  byte *pbVar3;
  byte *pbVar4;
  char ikey [2048];
  char istr [2048];
  byte local_1018 [2048];
  byte local_818 [2048];
  
  pbVar4 = local_1018;
  sVar1 = strlen(str);
  if (0x7ff < sVar1) {
    __assert_fail("strlen(str) < 2048",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/AutoGeometry.cpp"
                  ,0x1a6,
                  "virtual const char *HACD::MyAutoGeometry::stristr(const char *, const char *)");
  }
  sVar1 = strlen(key);
  if (0x7ff < sVar1) {
    __assert_fail("strlen(key) < 2048",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/AutoGeometry.cpp"
                  ,0x1a7,
                  "virtual const char *HACD::MyAutoGeometry::stristr(const char *, const char *)");
  }
  strncpy((char *)local_818,str,0x800);
  strncpy((char *)local_1018,key,0x800);
  if (local_818[0] != 0) {
    pbVar3 = local_818;
    do {
      pbVar3 = pbVar3 + 1;
      if ((byte)(local_818[0] + 0xbf) < 0x1a) {
        pbVar3[-1] = local_818[0] | 0x20;
      }
      local_818[0] = *pbVar3;
    } while (local_818[0] != 0);
  }
  while (local_1018[0] != 0) {
    if ((byte)(local_1018[0] + 0xbf) < 0x1a) {
      *pbVar4 = local_1018[0] | 0x20;
    }
    local_1018[0] = pbVar4[1];
    pbVar4 = pbVar4 + 1;
  }
  pcVar2 = strstr((char *)local_818,(char *)local_1018);
  if (pcVar2 != (char *)0x0) {
    pcVar2 = str + (uint)((int)pcVar2 - (int)local_818);
  }
  return pcVar2;
}

Assistant:

virtual const char * stristr(const char *str,const char *key)  // case insensitive ststr
		{
			HACD_ASSERT( strlen(str) < 2048 );
			HACD_ASSERT( strlen(key) < 2048 );

			char istr[2048];
			char ikey[2048];

			strncpy(istr,str,2048);
			strncpy(ikey,key,2048);
			mystrlwr(istr);
			mystrlwr(ikey);

			char *foo = strstr(istr,ikey);
			if ( foo )
			{
				hacd::HaU32 loc = (hacd::HaU32)(foo - istr);
				foo = (char *)str+loc;
			}

			return foo;
		}